

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t threshold,uint32_t simdWidth,uint32_t totalSimdWidth,
                   uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  undefined1 uVar5;
  undefined1 *puVar6;
  undefined8 *in_RCX;
  ulong *in_RDX;
  uint in_ESI;
  uint in_EDI;
  undefined8 *in_R8;
  byte in_R9B;
  uint in_stack_00000008;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd *src1End;
  simd *dst;
  simd *src1;
  simd compare;
  char compareValue;
  simd mask;
  char maskValue;
  undefined1 *local_130;
  byte *local_128;
  undefined8 *local_118;
  ulong *local_110;
  undefined8 *local_c8;
  ulong *local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_48;
  ulong uStack_40;
  
  local_c8 = in_RCX;
  if (in_R9B == 0) {
    for (; local_c8 != in_R8; local_c8 = (undefined8 *)((long)local_c8 + (ulong)in_ESI)) {
      memset(local_c8,0xff,(ulong)((uint)outXEnd + (uint)outX));
    }
  }
  else {
    auVar1 = vpinsrb_avx(ZEXT116(0x80),0x80,1);
    auVar1 = vpinsrb_avx(auVar1,0x80,2);
    auVar1 = vpinsrb_avx(auVar1,0x80,3);
    auVar1 = vpinsrb_avx(auVar1,0x80,4);
    auVar1 = vpinsrb_avx(auVar1,0x80,5);
    auVar1 = vpinsrb_avx(auVar1,0x80,6);
    auVar1 = vpinsrb_avx(auVar1,0x80,7);
    auVar1 = vpinsrb_avx(auVar1,0x80,8);
    auVar1 = vpinsrb_avx(auVar1,0x80,9);
    auVar1 = vpinsrb_avx(auVar1,0x80,10);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xe);
    auVar1 = vpinsrb_avx(auVar1,0x80,0xf);
    local_48 = auVar1._0_8_;
    uStack_40 = auVar1._8_8_;
    bVar4 = in_R9B + 0x7f;
    auVar1 = vpinsrb_avx(ZEXT116(bVar4),(uint)bVar4,1);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,2);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,3);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,4);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,5);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,6);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,7);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,8);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,9);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,10);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,0xb);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,0xc);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,0xd);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,0xe);
    auVar1 = vpinsrb_avx(auVar1,(uint)bVar4,0xf);
    local_c0 = in_RDX;
    for (; local_c8 != in_R8; local_c8 = (undefined8 *)((long)local_c8 + (ulong)in_ESI)) {
      local_118 = local_c8;
      for (local_110 = local_c0; local_110 != local_c0 + (ulong)in_stack_00000008 * 2;
          local_110 = local_110 + 2) {
        auVar3._8_8_ = local_110[1] ^ uStack_40;
        auVar3._0_8_ = *local_110 ^ local_48;
        uVar2 = vpcmpgtb_avx512vl(auVar3,auVar1);
        auVar3 = vpmovm2b_avx512vl(uVar2);
        local_a8 = auVar3._0_8_;
        uStack_a0 = auVar3._8_8_;
        *local_118 = local_a8;
        local_118[1] = uStack_a0;
        local_118 = local_118 + 2;
      }
      if ((uint)outX != 0) {
        local_128 = (byte *)((long)local_c0 + (ulong)(uint)outXEnd);
        local_130 = (undefined1 *)((long)local_c8 + (ulong)(uint)outXEnd);
        puVar6 = local_130 + (uint)outX;
        for (; local_130 != puVar6; local_130 = local_130 + 1) {
          uVar5 = 0xff;
          if (*local_128 < in_R9B) {
            uVar5 = 0;
          }
          *local_130 = uVar5;
          local_128 = local_128 + 1;
        }
      }
      local_c0 = (ulong *)((long)local_c0 + (ulong)in_EDI);
    }
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t threshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        // SSE does not have command "great or equal to" so we have 2 situations:
        // when threshold value is 0 and it is not
        if( threshold > 0 ) {
            const char maskValue = static_cast<char>(0x80u);
            const simd mask = _mm_set_epi8( maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                                            maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

            const char compareValue = static_cast<char>((threshold - 1) ^ 0x80u);
            const simd compare = _mm_set_epi8(
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue );

            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst )
                    _mm_storeu_si128( dst, _mm_cmpgt_epi8( _mm_xor_si128( _mm_loadu_si128( src1 ), mask ), compare ) );

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < threshold ? 0 : 255;
                }
            }
        }
        else {
            for( ; outY != outYEnd; outY += rowSizeOut )
                memset( outY, 255u, sizeof( uint8_t ) * (totalSimdWidth + nonSimdWidth) );
        }
    }